

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

FlagValue * __thiscall google::anon_unknown_1::FlagValue::New(FlagValue *this)

{
  char *type;
  FlagValue *this_00;
  undefined8 *valbuf;
  
  type = TypeName(this);
  switch(this->type_) {
  case '\0':
    this_00 = (FlagValue *)operator_new(0x10);
    valbuf = (undefined8 *)operator_new(1);
    *(undefined1 *)valbuf = 0;
    goto LAB_001937fe;
  case '\x01':
    this_00 = (FlagValue *)operator_new(0x10);
    valbuf = (undefined8 *)operator_new(4);
    goto LAB_001937ba;
  case '\x02':
    this_00 = (FlagValue *)operator_new(0x10);
    valbuf = (undefined8 *)operator_new(4);
LAB_001937ba:
    *(undefined4 *)valbuf = 0;
    goto LAB_001937fe;
  case '\x03':
    this_00 = (FlagValue *)operator_new(0x10);
    valbuf = (undefined8 *)operator_new(8);
    break;
  case '\x04':
    this_00 = (FlagValue *)operator_new(0x10);
    valbuf = (undefined8 *)operator_new(8);
    break;
  case '\x05':
    this_00 = (FlagValue *)operator_new(0x10);
    valbuf = (undefined8 *)operator_new(8);
    break;
  case '\x06':
    this_00 = (FlagValue *)operator_new(0x10);
    valbuf = (undefined8 *)operator_new(0x20);
    *valbuf = valbuf + 2;
    valbuf[1] = 0;
    *(undefined1 *)(valbuf + 2) = 0;
    goto LAB_001937fe;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x1c2,"FlagValue *google::(anonymous namespace)::FlagValue::New() const");
  }
  *valbuf = 0;
LAB_001937fe:
  FlagValue(this_00,valbuf,type,true);
  return this_00;
}

Assistant:

FlagValue* FlagValue::New() const {
  const char *type = TypeName();
  switch (type_) {
    case FV_BOOL:   return new FlagValue(new bool(false), type, true);
    case FV_INT32:  return new FlagValue(new int32(0), type, true);
    case FV_UINT32: return new FlagValue(new uint32(0), type, true);
    case FV_INT64:  return new FlagValue(new int64(0), type, true);
    case FV_UINT64: return new FlagValue(new uint64(0), type, true);
    case FV_DOUBLE: return new FlagValue(new double(0.0), type, true);
    case FV_STRING: return new FlagValue(new string, type, true);
    default: assert(false); return NULL;  // unknown type
  }
}